

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

JsonnetJsonValue * jsonnet_json_make_string(JsonnetVm *vm,char *v)

{
  JsonnetJsonValue *this;
  char *in_RSI;
  JsonnetJsonValue *r;
  
  this = (JsonnetJsonValue *)operator_new(0x78);
  memset(this,0,0x78);
  JsonnetJsonValue::JsonnetJsonValue(this);
  this->kind = STRING;
  std::__cxx11::string::operator=((string *)&this->string,in_RSI);
  return this;
}

Assistant:

JsonnetJsonValue *jsonnet_json_make_string(JsonnetVm *vm, const char *v)
{
    (void)vm;
    JsonnetJsonValue *r = new JsonnetJsonValue();
    r->kind = JsonnetJsonValue::STRING;
    r->string = v;
    return r;
}